

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264StreamReader.cpp
# Opt level: O0

int __thiscall
H264StreamReader::writeAdditionData
          (H264StreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,AVPacket *avPacket,
          PriorityDataInfo *priorityData)

{
  long lVar1;
  long lVar2;
  long lVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  ostream *poVar7;
  VodCoreException *pVVar8;
  uint8_t *puVar9;
  pointer ppVar10;
  reference ppVar11;
  type *ppPVar12;
  size_type sVar13;
  byte local_c3e;
  byte local_c3d;
  byte local_c3c;
  byte local_c3b;
  byte local_c3a;
  bool local_c39;
  undefined1 local_c20 [8];
  SEIUnit sei;
  pair<int,_int> local_a78;
  uint8_t *local_a70;
  uint8_t *prevPos;
  uint8_t *srcData;
  int64_t pts90k;
  SEIUnit sei_1;
  string local_8b0;
  ostringstream local_890 [8];
  ostringstream ss_4;
  string local_710;
  ostringstream local_6f0 [8];
  ostringstream ss_3;
  type *pps;
  type *index;
  PPSUnit *local_560;
  _Self local_558;
  iterator __end2;
  iterator __begin2;
  map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
  *__range2;
  string local_538;
  ostringstream local_518 [8];
  ostringstream ss_2;
  int sRez;
  ostringstream local_378 [8];
  ostringstream ss_1;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_> local_200;
  SPSUnit *local_1f8;
  SPSUnit *sps;
  undefined1 local_1e8 [3];
  bool needInsSpsPps;
  bool spsDiscontinue;
  bool srcSpsPpsFound;
  bool needInsTimingSEI;
  ostringstream local_1b8 [8];
  ostringstream ss;
  uint8_t *puStack_38;
  NALType nalType;
  uint8_t *curPos;
  PriorityDataInfo *priorityData_local;
  AVPacket *avPacket_local;
  uint8_t *dstEnd_local;
  uint8_t *dstBuffer_local;
  H264StreamReader *this_local;
  
  puStack_38 = dstBuffer;
  if (((4 < avPacket->size) && ((long)avPacket->size < (long)dstEnd - (long)dstBuffer)) &&
     ((bVar4 = avPacket->data[4] & 0x1f, bVar4 == 9 || (bVar4 == 0x18)))) {
    this->m_delimiterFound = true;
    memcpy(dstBuffer,avPacket->data,(long)avPacket->size);
    puStack_38 = dstBuffer + avPacket->size;
    avPacket->size = 0;
    avPacket->data = (uint8_t *)0x0;
  }
  if (((this->m_delimiterFound & 1U) == 0) && (this->m_lastSliceSPS != 0xffffffff)) {
    if ((this->m_firstAUDWarn & 1U) != 0) {
      this->m_firstAUDWarn = false;
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "H264 bitstream changed: insert nal unit delimiters");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
    }
    if ((long)dstEnd - (long)puStack_38 < 6) {
      std::__cxx11::ostringstream::ostringstream(local_1b8);
      std::operator<<((ostream *)local_1b8,"H264 stream error: Not enough buffer for write headers")
      ;
      sps._7_1_ = 1;
      pVVar8 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar8,3,(string *)local_1e8);
      sps._7_1_ = 0;
      __cxa_throw(pVVar8,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    puVar9 = writeNalPrefix(this,puStack_38);
    if (((this->m_mvcSubStream & 1U) == 0) || ((this->m_blurayMode & 1U) == 0)) {
      *puVar9 = '\t';
      puStack_38 = puVar9 + 2;
      puVar9[1] = (byte)(this->m_pict_type << 5) | 0x10;
    }
    else {
      puStack_38 = puVar9 + 1;
      *puVar9 = '\x18';
    }
  }
  local_c39 = false;
  if ((this->m_needSeiCorrection & 1U) != 0) {
    local_c39 = this->m_lastSliceSPS != 0xffffffff;
  }
  sps._6_1_ = local_c39;
  sps._5_1_ = (avPacket->flags & 0x20) != 0;
  local_c3a = 0;
  if ((this->m_h264SPSCont & 1U) == 0) goto LAB_0029a2c3;
  if (this->m_spsCounter < 2) {
    if (((this->super_MPEGStreamReader).m_totalFrameNum < 2) ||
       (local_c3b = 1, (this->m_lastSliceIDR & 1U) == 0)) {
      if (0xfa < (this->super_MPEGStreamReader).m_totalFrameNum) {
        bVar5 = isIFrame(this);
        local_c3b = 1;
        if (bVar5) goto LAB_0029a2b7;
      }
      goto LAB_0029a285;
    }
  }
  else {
LAB_0029a285:
    local_c3c = 0;
    if ((this->m_firstFileFrame & 1U) != 0) {
      local_c3c = sps._5_1_ ^ 0xff;
    }
    local_c3b = local_c3c;
  }
LAB_0029a2b7:
  local_c3a = local_c3b;
LAB_0029a2c3:
  sps._4_1_ = local_c3a & 1;
  sps._3_1_ = 0;
  bVar5 = isIFrame(this);
  if (((bVar5) && (this->m_lastSliceSPS != 0xffffffff)) && (this->m_lastSlicePPS != 0xffffffff)) {
    local_c3d = 1;
    if ((sps._4_1_ & 1) == 0) {
      bVar5 = replaceToOwnSPS(this);
      local_c3e = 0;
      if (bVar5) {
        local_c3e = sps._5_1_;
      }
      local_c3d = local_c3e;
    }
    sps._3_1_ = local_c3d & 1;
  }
  if ((sps._3_1_ & 1) != 0) {
    avPacket->flags = avPacket->flags | 0x20;
    if ((((this->m_firstSPSWarn & 1U) != 0) &&
        (0xfa < (this->super_MPEGStreamReader).m_totalFrameNum)) &&
       (this->m_firstSPSWarn = false, (sps._4_1_ & 1) != 0)) {
      poVar7 = std::operator<<((ostream *)&std::cout,"H264 bitstream changed: insert SPS/PPS units")
      ;
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
    }
    local_200._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_SPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_SPSUnit_*>_>_>
         ::find(&this->m_spsMap,&this->m_lastSliceSPS);
    ppVar10 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_SPSUnit_*>_>::operator->
                        (&local_200);
    local_1f8 = ppVar10->second;
    if ((long)dstEnd - (long)puStack_38 < 4) {
      std::__cxx11::ostringstream::ostringstream(local_378);
      std::operator<<((ostream *)local_378,"H264 stream error: Not enough buffer for write headers")
      ;
      pVVar8 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar8,3,(string *)&sRez);
      __cxa_throw(pVVar8,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    puStack_38 = writeNalPrefix(this,puStack_38);
    iVar6 = NALUnit::serializeBuffer(&local_1f8->super_NALUnit,puStack_38,dstEnd,false);
    if (iVar6 == -1) {
      std::__cxx11::ostringstream::ostringstream(local_518);
      std::operator<<((ostream *)local_518,"H264 stream error: Not enough buffer for write headers")
      ;
      pVVar8 = (VodCoreException *)__cxa_allocate_exception(0x28);
      std::__cxx11::ostringstream::str();
      VodCoreException::VodCoreException(pVVar8,3,&local_538);
      __cxa_throw(pVVar8,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
    }
    puStack_38 = puStack_38 + iVar6;
    __end2 = std::
             map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
             ::begin(&this->m_ppsMap);
    local_558._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_PPSUnit_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_PPSUnit_*>_>_>
         ::end(&this->m_ppsMap);
    while (bVar5 = std::operator!=(&__end2,&local_558), bVar5) {
      ppVar11 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_PPSUnit_*>_>::operator*
                          (&__end2);
      index = *(type **)ppVar11;
      local_560 = ppVar11->second;
      std::get<0ul,unsigned_int_const,PPSUnit*>((pair<const_unsigned_int,_PPSUnit_*> *)&index);
      ppPVar12 = std::get<1ul,unsigned_int_const,PPSUnit*>
                           ((pair<const_unsigned_int,_PPSUnit_*> *)&index);
      if ((long)dstEnd - (long)puStack_38 < 4) {
        std::__cxx11::ostringstream::ostringstream(local_6f0);
        std::operator<<((ostream *)local_6f0,
                        "H264 stream error: Not enough buffer for write headers");
        pVVar8 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(pVVar8,3,&local_710);
        __cxa_throw(pVVar8,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      puStack_38 = writeNalPrefix(this,puStack_38);
      iVar6 = NALUnit::serializeBuffer(&(*ppPVar12)->super_NALUnit,puStack_38,dstEnd,false);
      if (iVar6 == -1) {
        std::__cxx11::ostringstream::ostringstream(local_890);
        std::operator<<((ostream *)local_890,
                        "H264 stream error: Not enough buffer for write headers");
        sei_1.m_mvcHeaderStart._7_1_ = 1;
        pVVar8 = (VodCoreException *)__cxa_allocate_exception(0x28);
        std::__cxx11::ostringstream::str();
        VodCoreException::VodCoreException(pVVar8,3,&local_8b0);
        sei_1.m_mvcHeaderStart._7_1_ = 0;
        __cxa_throw(pVVar8,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
      }
      puStack_38 = puStack_38 + iVar6;
      std::_Rb_tree_iterator<std::pair<const_unsigned_int,_PPSUnit_*>_>::operator++(&__end2);
    }
  }
  if ((sps._6_1_ & 1) != 0) {
    if ((this->m_firstSEIWarn & 1U) != 0) {
      this->m_firstSEIWarn = false;
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "H264 bitstream changed: insert pict timing and buffering period SEI units"
                              );
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      sLastMsg = true;
    }
    if ((this->m_lastIFrame & 1U) != 0) {
      if ((this->m_lastSliceIDR & 1U) != 0) {
        SEIUnit::SEIUnit((SEIUnit *)&pts90k);
        sei_1.cpb_removal_delay = 0xd0bd8;
        sei_1.initial_cpb_removal_delay[0x1e] = 0;
        iVar6 = writeSEIMessage(this,puStack_38,dstEnd,(SEIUnit *)&pts90k,'\0');
        puStack_38 = puStack_38 + iVar6;
        SEIUnit::~SEIUnit((SEIUnit *)&pts90k);
      }
      if (((this->m_mvcSubStream & 1U) != 0) &&
         (bVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                            (&this->m_bdRomMetaDataMsg), !bVar5)) {
        srcData = (uint8_t *)((this->super_MPEGStreamReader).m_curDts / 0xe5b0 + this->m_startPts);
        prevPos = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                            (&this->m_bdRomMetaDataMsg);
        SEIUnit::updateMetadataPts(prevPos + this->m_bdRomMetaDataMsgPtsPos,(int64_t)srcData);
        local_a70 = puStack_38;
        puStack_38 = writeNalPrefix(this,puStack_38);
        puVar9 = prevPos;
        sVar13 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                           (&this->m_bdRomMetaDataMsg);
        iVar6 = NALUnit::encodeNAL(puVar9,puVar9 + sVar13,puStack_38,(long)dstEnd - (long)puStack_38
                                  );
        puStack_38 = puStack_38 + iVar6;
        if (priorityData != (PriorityDataInfo *)0x0) {
          sei.m_mvcHeaderStart._4_4_ = (int)local_a70 - (int)dstBuffer;
          sei.m_mvcHeaderStart._0_4_ = (int)puStack_38 - (int)local_a70;
          local_a78 = std::make_pair<int,int>
                                ((int *)((long)&sei.m_mvcHeaderStart + 4),
                                 (int *)&sei.m_mvcHeaderStart);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
                    (priorityData,&local_a78);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_bdRomMetaDataMsg)
        ;
      }
    }
    SEIUnit::SEIUnit((SEIUnit *)local_c20);
    sei.m_processedMessages._M_h._M_single_bucket._0_4_ = this->m_removalDelay;
    lVar1 = (this->super_MPEGStreamReader).m_curPts;
    lVar2 = (this->super_MPEGStreamReader).m_curDts;
    lVar3 = (this->super_MPEGStreamReader).m_pcrIncPerFrame;
    iVar6 = getFrameDepth(this);
    sei.m_processedMessages._M_h._M_single_bucket._4_4_ =
         (undefined4)
         ((((lVar1 - lVar2) + lVar3 * iVar6) * 2) / (this->super_MPEGStreamReader).m_pcrIncPerFrame)
    ;
    sei.super_NALUnit.bitReader.m_curVal._0_1_ = this->m_lastPictStruct;
    if ((this->m_lastSliceIDR & 1U) != 0) {
      this->m_removalDelay = 0;
    }
    this->m_removalDelay = this->m_removalDelay + 2;
    iVar6 = writeSEIMessage(this,puStack_38,dstEnd,(SEIUnit *)local_c20,'\x01');
    puStack_38 = puStack_38 + iVar6;
    SEIUnit::~SEIUnit((SEIUnit *)local_c20);
  }
  this->m_firstFileFrame = false;
  return (int)puStack_38 - (int)dstBuffer;
}

Assistant:

int H264StreamReader::writeAdditionData(uint8_t *dstBuffer, uint8_t *dstEnd, AVPacket &avPacket,
                                        PriorityDataInfo *priorityData)
{
    uint8_t *curPos = dstBuffer;
    if (avPacket.size > 4 && avPacket.size < dstEnd - dstBuffer)
    {
        auto nalType = static_cast<NALUnit::NALType>(avPacket.data[4] & 0x1f);
        if (nalType == NALUnit::NALType::nuDelimiter || nalType == NALUnit::NALType::nuDRD)
        {
            // place delimiter at first place
            m_delimiterFound = true;
            memcpy(curPos, avPacket.data, avPacket.size);
            curPos += avPacket.size;
            avPacket.size = 0;
            avPacket.data = nullptr;
        }
    }

    if (!m_delimiterFound && m_lastSliceSPS != UINT_MAX)
    {
        if (m_firstAUDWarn)
        {
            m_firstAUDWarn = false;
            LTRACE(LT_INFO, 2, "H264 bitstream changed: insert nal unit delimiters");
        }
        if (dstEnd - curPos < 6)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos = writeNalPrefix(curPos);
        if (m_mvcSubStream && m_blurayMode)
        {
            *curPos++ = static_cast<uint8_t>(NALUnit::NALType::nuDRD);
        }
        else
        {
            *curPos++ = static_cast<uint8_t>(NALUnit::NALType::nuDelimiter);
            *curPos++ = static_cast<uint8_t>(m_pict_type << 5 | 0x10);  // primary_pic_type << 5 + rbsp bits
        }
    }

    bool needInsTimingSEI = m_needSeiCorrection && m_lastSliceSPS != UINT_MAX;
    bool srcSpsPpsFound = avPacket.flags & AVPacket::IS_SPS_PPS_IN_GOP;
    bool spsDiscontinue =
        m_h264SPSCont &&
        ((m_spsCounter < 2 && ((m_totalFrameNum > 1 && m_lastSliceIDR) || (m_totalFrameNum > 250 && isIFrame()))) ||
         (m_firstFileFrame && !srcSpsPpsFound));
    bool needInsSpsPps = false;
    if (isIFrame() && m_lastSliceSPS != UINT_MAX && m_lastSlicePPS != UINT_MAX)
    {
        needInsSpsPps = spsDiscontinue || (replaceToOwnSPS() && srcSpsPpsFound);
    }

    if (needInsSpsPps)
    {
        avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

        // Why the check for 250 : unless we see the 2nd IDR frame, we can only see that the stream runs with open GOPs
        // (open GOPs with one IDR at start for the whole movie do happen). That's why there's also a check that there's
        // a SPS before for the first I-frame in the first GOP in a normal stream. There's nothing scary about that - we
        // simply insert one more SPS - but in order to avoid outputting messages into the console, I left the check at
        // 250.
        if (m_firstSPSWarn && m_totalFrameNum > 250)
        {
            m_firstSPSWarn = false;
            if (spsDiscontinue)
            {
                LTRACE(LT_INFO, 2, "H264 bitstream changed: insert SPS/PPS units");
            }
        }
        SPSUnit *sps = m_spsMap.find(m_lastSliceSPS)->second;
        if (dstEnd - curPos < 4)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos = writeNalPrefix(curPos);
        int sRez = sps->serializeBuffer(curPos, dstEnd, false);
        if (sRez == -1)
            THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
        curPos += sRez;

        // PPSUnit* pps = m_ppsMap.find(m_lastSlicePPS)->second;
        // curPos = writeNalPrefix(curPos);
        // curPos += pps->serializeBuffer(curPos, false);
        for (auto [index, pps] : m_ppsMap)
        {
            if (dstEnd - curPos < 4)
                THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
            curPos = writeNalPrefix(curPos);
            sRez = pps->serializeBuffer(curPos, dstEnd, false);
            if (sRez == -1)
                THROW(ERR_COMMON, "H264 stream error: Not enough buffer for write headers")
            curPos += sRez;
        }
    }

    if (needInsTimingSEI)
    {
        if (m_firstSEIWarn)
        {
            m_firstSEIWarn = false;
            LTRACE(LT_INFO, 2, "H264 bitstream changed: insert pict timing and buffering period SEI units");
        }

        if (m_lastIFrame)
        {
            if (m_lastSliceIDR)
            {
                SEIUnit sei;
                sei.initial_cpb_removal_delay[0] = 855000;
                sei.initial_cpb_removal_delay_offset[0] = 0;
                curPos += writeSEIMessage(curPos, dstEnd, sei, SEI_MSG_BUFFERING_PERIOD);
            }

            if (m_mvcSubStream)
            {
                if (!m_bdRomMetaDataMsg.empty())
                {
                    // we got slice. fill previous metadata SEI message
                    auto pts90k = m_curDts / INT_FREQ_TO_TS_FREQ + m_startPts;
                    uint8_t *srcData = m_bdRomMetaDataMsg.data();
                    SEIUnit::updateMetadataPts(srcData + m_bdRomMetaDataMsgPtsPos, pts90k);

                    uint8_t *prevPos = curPos;
                    curPos = writeNalPrefix(curPos);
                    curPos += NALUnit::encodeNAL(srcData, srcData + m_bdRomMetaDataMsg.size(), curPos, dstEnd - curPos);
                    if (priorityData)
                        priorityData->push_back(std::make_pair<int, int>(static_cast<int>(prevPos - dstBuffer),
                                                                         static_cast<int>(curPos - prevPos)));
                    m_bdRomMetaDataMsg.clear();
                }
            }
        }

        SEIUnit sei;
        sei.cpb_removal_delay = m_removalDelay;
        sei.dpb_output_delay =
            static_cast<int>(((m_curPts - m_curDts + m_pcrIncPerFrame * getFrameDepth()) * 2) / m_pcrIncPerFrame);
        sei.pic_struct = m_lastPictStruct;

        if (m_lastSliceIDR)
            m_removalDelay = 0;
        m_removalDelay += 2;
        curPos += writeSEIMessage(curPos, dstEnd, sei, SEI_MSG_PIC_TIMING);
    }
    m_firstFileFrame = false;
    return static_cast<int>(curPos - dstBuffer);
}